

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeIPCurvature(ChElementShellReissner4 *this)

{
  long lVar1;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *this_00;
  code *pcVar2;
  ChMatrix33<double> *pCVar3;
  Scalar *pSVar4;
  undefined **ppuVar5;
  int n;
  long lVar6;
  long row;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *this_01;
  ChVector<double> *pCVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChElementShellReissner4 *local_3e0;
  double local_3d8;
  ChMatrix33<double> *local_3d0;
  ChMatrix33<double> *local_3c8;
  long local_3c0;
  ChVector<double> phi_tilde_2_i;
  ChVector<double> phi_tilde_1_i;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_318;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_2f0;
  ChMatrix33<double> mDrot_I;
  ChMatrix33<double> T_overlineGamma_tilde_i;
  ChMatrix33<double> tmp2;
  ChMatrix33<double> mGamma_tilde_i;
  ChMatrix33<double> tmp1;
  ChMatrix33<double> Gamma_I_n_MT_T_overline [4];
  
  local_3d0 = &this->T_overline;
  pCVar7 = this->phi_tilde_n;
  for (lVar6 = 0; lVar6 != 0x120; lVar6 = lVar6 + 0x48) {
    rotutils::DRot_I(&mDrot_I,pCVar7);
    mGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)local_3d0;
    mGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&mDrot_I;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)
               ((long)Gamma_I_n_MT_T_overline[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + lVar6),
               (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
                *)&mGamma_tilde_i);
    pCVar7 = pCVar7 + 1;
  }
  local_3e0 = this;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1> *)
              (this->L_alpha_beta_i + lVar6);
    phi_tilde_1_i.m_data[2] = 0.0;
    phi_tilde_2_i.m_data[2] = 0.0;
    phi_tilde_1_i.m_data[0] = 0.0;
    phi_tilde_1_i.m_data[1] = 0.0;
    phi_tilde_2_i.m_data[0] = 0.0;
    phi_tilde_2_i.m_data[1] = 0.0;
    InterpDeriv(this->phi_tilde_n,(ChMatrixNM<double,_4,_2> *)this_01,&phi_tilde_1_i,&phi_tilde_2_i)
    ;
    pCVar7 = this->phi_tilde_i + lVar6;
    rotutils::DRot(&mGamma_tilde_i,pCVar7);
    pCVar3 = local_3d0;
    mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_3d0;
    mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&mGamma_tilde_i;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&T_overlineGamma_tilde_i,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&mDrot_I);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = phi_tilde_1_i.m_data[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = phi_tilde_1_i.m_data[2];
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         phi_tilde_1_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar16 = vfmadd231sd_fma(auVar23,auVar15,auVar20);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         phi_tilde_1_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar13 = vfmadd231sd_fma(auVar24,auVar12,auVar20);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         phi_tilde_1_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar10 = vfmadd231sd_fma(auVar22,auVar9,auVar20);
    auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar18);
    auVar16 = vfmadd231sd_fma(auVar16,auVar17,auVar18);
    auVar13 = vfmadd231sd_fma(auVar13,auVar14,auVar18);
    this->k_1_i[lVar6].m_data[0] = auVar10._0_8_;
    this->k_1_i[lVar6].m_data[1] = auVar13._0_8_;
    this->k_1_i[lVar6].m_data[2] = auVar16._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = phi_tilde_2_i.m_data[0];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = phi_tilde_2_i.m_data[2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         phi_tilde_2_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar16 = vfmadd231sd_fma(auVar16,auVar21,auVar15);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         phi_tilde_2_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar12);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         phi_tilde_2_i.m_data[1] *
         T_overlineGamma_tilde_i.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar21);
    auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar19);
    auVar16 = vfmadd231sd_fma(auVar16,auVar19,auVar17);
    auVar13 = vfmadd231sd_fma(auVar13,auVar19,auVar14);
    this->k_2_i[lVar6].m_data[0] = auVar10._0_8_;
    this->k_2_i[lVar6].m_data[1] = auVar13._0_8_;
    this->k_2_i[lVar6].m_data[2] = auVar16._0_8_;
    rotutils::Elle(&mDrot_I,pCVar7,&phi_tilde_1_i);
    tmp2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)pCVar3;
    tmp2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&mDrot_I;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&tmp1,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&tmp2);
    rotutils::Elle(&mDrot_I,pCVar7,&phi_tilde_2_i);
    local_318.m_lhs.m_lhs = &pCVar3->super_Matrix<double,_3,_3,_1,_3,_3>;
    local_318.m_lhs.m_rhs = (RhsNested)&mDrot_I;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&tmp2,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_318);
    ppuVar5 = &LI;
    row = 0;
    for (lVar8 = 0; lVar8 != 0x120; lVar8 = lVar8 + 0x48) {
      local_3c8 = &tmp1;
      lVar1 = (long)Gamma_I_n_MT_T_overline[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + lVar8;
      pcVar2 = (code *)*ppuVar5;
      local_3c0 = lVar1;
      local_3d8 = (double)(*pcVar2)(&xi_i + lVar6 * 2);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
      ::operator*(&local_318,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                   *)&local_3c8,&local_3d8);
      this_00 = (MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)
                ((long)local_3e0->Phi_Delta_i[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + lVar8);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                         (this_01,row,0);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*(&local_2f0,this_00,pSVar4);
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_318.m_lhs.m_lhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_318.m_lhs.m_rhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_318.m_rhs.m_functor.m_other;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_2f0.m_lhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_2f0.m_rhs.m_functor.m_other;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)
                 ((long)local_3e0->Kappa_delta_i_1[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar8),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)&mDrot_I);
      local_3c8 = &tmp2;
      local_3c0 = lVar1;
      local_3d8 = (double)(*pcVar2)(&xi_i + lVar6 * 2);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
      ::operator*(&local_318,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                   *)&local_3c8,&local_3d8);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>,_1>::operator()
                         (this_01,row,1);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*(&local_2f0,this_00,pSVar4);
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_318.m_lhs.m_lhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_318.m_lhs.m_rhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_318.m_rhs.m_functor.m_other;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_2f0.m_lhs;
      mDrot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_2f0.m_rhs.m_functor.m_other;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)
                 ((long)local_3e0->Kappa_delta_i_2[0][0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar8),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                  *)&mDrot_I);
      row = row + 1;
      ppuVar5 = ppuVar5 + 1;
    }
    local_3e0 = (ChElementShellReissner4 *)
                ((local_3e0->m_MassMatrix).
                 super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                 array + 0xc);
  }
  return;
}

Assistant:

void ChElementShellReissner4::ComputeIPCurvature() {
    ChMatrix33<> Gamma_I_n_MT_T_overline[NUMNODES];
    for (int n = 0; n < NUMNODES; n++) {
        ChMatrix33<> mDrot_I = rotutils::DRot_I(phi_tilde_n[n]);
#ifdef CHSIMPLIFY_DROT
        mDrot_I = ChMatrix33<>(1);
#endif
        Gamma_I_n_MT_T_overline[n] = mDrot_I * T_overline.transpose();
    }
    for (int i = 0; i < NUMIP; i++) {
        ChVector<> phi_tilde_1_i;
        ChVector<> phi_tilde_2_i;
        InterpDeriv(phi_tilde_n, L_alpha_beta_i[i], phi_tilde_1_i, phi_tilde_2_i);
        ChMatrix33<> mGamma_tilde_i = rotutils::DRot(phi_tilde_i[i]);
#ifdef CHSIMPLIFY_DROT
        mGamma_tilde_i = ChMatrix33<>(1);
#endif
        ChMatrix33<> T_overlineGamma_tilde_i(T_overline * mGamma_tilde_i);
        k_1_i[i] = T_overlineGamma_tilde_i * phi_tilde_1_i;
        k_2_i[i] = T_overlineGamma_tilde_i * phi_tilde_2_i;
        ChMatrix33<> tmp1 = T_overline * rotutils::Elle(phi_tilde_i[i], phi_tilde_1_i);
        ChMatrix33<> tmp2 = T_overline * rotutils::Elle(phi_tilde_i[i], phi_tilde_2_i);
#ifdef CHSIMPLIFY_DROT
        tmp1 = T_overline;
        tmp2 = T_overline;
#endif
        for (int n = 0; n < NUMNODES; n++) {
            Kappa_delta_i_1[i][n] =
                tmp1 * Gamma_I_n_MT_T_overline[n] * LI[n](xi_i[i]) + Phi_Delta_i[i][n] * L_alpha_beta_i[i](n, 0);
            Kappa_delta_i_2[i][n] =
                tmp2 * Gamma_I_n_MT_T_overline[n] * LI[n](xi_i[i]) + Phi_Delta_i[i][n] * L_alpha_beta_i[i](n, 1);
        }
    }
}